

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall djb::fresnel::sgd::sgd(sgd *this,vec3 *f0,vec3 *f1)

{
  float_t fVar1;
  valarray<float> local_38;
  
  (this->super_impl)._vptr_impl = (_func_int **)&PTR_clone_001efce8;
  (this->f0)._M_size = 0;
  (this->f0)._M_data = (float *)0x0;
  (this->f1)._M_size = 0;
  (this->f1)._M_data = (float *)0x0;
  local_38._M_size = 3;
  local_38._M_data = (float *)operator_new(0xc);
  local_38._M_data[2] = f0->z;
  fVar1 = f0->y;
  local_38._M_data[0] = f0->x;
  local_38._M_data[1] = fVar1;
  std::valarray<float>::operator=(&this->f0,&local_38);
  operator_delete(local_38._M_data);
  local_38._M_size = 3;
  local_38._M_data = (float *)operator_new(0xc);
  local_38._M_data[2] = f1->z;
  fVar1 = f1->y;
  local_38._M_data[0] = f1->x;
  local_38._M_data[1] = fVar1;
  std::valarray<float>::operator=(&this->f1,&local_38);
  operator_delete(local_38._M_data);
  return;
}

Assistant:

sgd::sgd(const vec3 &f0, const vec3 &f1)
{
	this->f0 = brdf::value_type(&f0.x, 3);
	this->f1 = brdf::value_type(&f1.x, 3);
}